

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::_q_moveTab(QMdiAreaPrivate *this,int from,int to)

{
  Data *pDVar1;
  qsizetype qVar2;
  QObject *mdiChild;
  long in_FS_OFFSET;
  int indexToActiveWindow;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QPointer<QMdiSubWindow>_>::move(&this->childWindows,(long)from,(long)to);
  qVar2 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (&this->childWindows,&this->active,0);
  local_2c = (int)qVar2;
  if (local_2c != -1) {
    qVar2 = QtPrivate::indexOf<int,int>(&this->indicesToActivatedChildren,&local_2c,0);
    if ((int)qVar2 != 0) {
      mdiChild = (QObject *)0x0;
      QList<int>::move(&this->indicesToActivatedChildren,(long)(int)qVar2,0);
      pDVar1 = (this->active).wp.d;
      if (pDVar1 != (Data *)0x0) {
        if (*(int *)(pDVar1 + 4) == 0) {
          mdiChild = (QObject *)0x0;
        }
        else {
          mdiChild = (this->active).wp.value;
        }
      }
      internalRaise(this,(QMdiSubWindow *)mdiChild);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::_q_moveTab(int from, int to)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(from);
    Q_UNUSED(to);
#else
    childWindows.move(from, to);

    // Put the active window in front to update activation order.
    const int indexToActiveWindow = childWindows.indexOf(active);
    if (indexToActiveWindow != -1) {
        const int index = indicesToActivatedChildren.indexOf(indexToActiveWindow);
        Q_ASSERT(index != -1);
        if (index != 0) { // if it's not in front
            indicesToActivatedChildren.move(index, 0);
            internalRaise(active);
        }
    }
#endif // QT_CONFIG(tabbar)
}